

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O0

REF_STATUS ref_layer_align_quad(REF_GRID ref_grid)

{
  REF_MIGRATE_PARTIONER RVar1;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_MIGRATE_PARTIONER previous;
  REF_GRID ref_grid_local;
  
  RVar1 = ref_grid->partitioner;
  ref_grid->partitioner = REF_MIGRATE_SINGLE;
  ref_grid_local._4_4_ = ref_migrate_to_balance(ref_grid);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ = ref_layer_align_quad_seq(ref_grid);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid->partitioner = RVar1;
      ref_grid_local._4_4_ = ref_migrate_to_balance(ref_grid);
      if (ref_grid_local._4_4_ == 0) {
        ref_grid_local._4_4_ = 0;
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
               0x2d1,"ref_layer_align_quad",(ulong)ref_grid_local._4_4_,"migrate to single part");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2cf
             ,"ref_layer_align_quad",(ulong)ref_grid_local._4_4_,"quad");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",0x2ce,
           "ref_layer_align_quad",(ulong)ref_grid_local._4_4_,"migrate to single part");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_layer_align_quad(REF_GRID ref_grid) {
  REF_MIGRATE_PARTIONER previous;
  previous = ref_grid_partitioner(ref_grid);
  ref_grid_partitioner(ref_grid) = REF_MIGRATE_SINGLE;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  RSS(ref_layer_align_quad_seq(ref_grid), "quad");
  ref_grid_partitioner(ref_grid) = previous;
  RSS(ref_migrate_to_balance(ref_grid), "migrate to single part");
  return REF_SUCCESS;
}